

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colored.cpp
# Opt level: O3

bool __thiscall Colored::setRGB(Colored *this,int color,int *rgb)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  
  bVar1 = true;
  if (color < 1) {
    iVar2 = 0xff;
    if (color == -1) {
      uVar3 = 0xcc00000099;
    }
    else {
      if (color != 0) {
        return false;
      }
      uVar3 = 0xff000000ff;
    }
  }
  else if (color == 1) {
    uVar3 = 0x99000000ff;
    iVar2 = 0x99;
  }
  else if (color == 100) {
    uVar3 = 0xfa000000ff;
    iVar2 = 0xf0;
  }
  else {
    if (color != 0x65) {
      return false;
    }
    uVar3 = 0;
    iVar2 = 0;
    bVar1 = false;
  }
  *(undefined8 *)rgb = uVar3;
  rgb[2] = iVar2;
  return bVar1;
}

Assistant:

bool Colored::setRGB(int color, int rgb[]){
    bool flag = true;
    switch (color) {
        case -1:
            rgb[0] = 153;   rgb[1] = 204;   rgb[2] = 255; //blue
            break;
        case 0:
            rgb[0] = 255;   rgb[1] = 255;   rgb[2] = 255; //white
            break;
        case 1:
            rgb[0] = 255;   rgb[1] = 153;   rgb[2] = 153; //red
            break;
        case 100:
            rgb[0] = 255;   rgb[1] = 250;   rgb[2] = 240; //gray
            break;
        case 101:
            rgb[0] = 0;     rgb[1] = 0;     rgb[2] = 0;   //black
        default:
            flag = false;
            break;
    }
    return flag;
}